

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

int Abc_NtkCountBarBufs(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar3 = (long)pNtk->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      plVar1 = (long *)pNtk->vObjs->pArray[lVar4];
      if ((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) {
        uVar5 = 0;
        if ((*(int *)(*plVar1 + 4) == 4) && (uVar5 = 0, *(int *)((long)plVar1 + 0x1c) == 1)) {
          uVar5 = (uint)(plVar1[7] == 0);
        }
        iVar2 = iVar2 + uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Abc_NtkCountBarBufs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
        Counter += Abc_ObjIsBarBuf( pObj );
    return Counter;
}